

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver2.c
# Opt level: O0

void solver2_canceluntil(sat_solver2 *s,int level)

{
  int iVar1;
  int iVar2;
  int v;
  int iVar3;
  int *piVar4;
  int local_20;
  int x;
  int c;
  int lastLev;
  int bound;
  int level_local;
  sat_solver2 *s_local;
  
  iVar1 = solver2_dlevel(s);
  if (level < iVar1) {
    iVar1 = solver2_dlevel(s);
    if (iVar1 < 1) {
      __assert_fail("solver2_dlevel(s) > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                    ,0x1f0,"void solver2_canceluntil(sat_solver2 *, int)");
    }
    piVar4 = veci_begin(&s->trail_lim);
    iVar1 = piVar4[level];
    piVar4 = veci_begin(&s->trail_lim);
    iVar2 = veci_size(&s->trail_lim);
    iVar2 = piVar4[iVar2 + -1];
    local_20 = s->qtail;
    while (local_20 = local_20 + -1, iVar1 <= local_20) {
      v = lit_var(s->trail[local_20]);
      var_set_value(s,v,3);
      s->reasons[v] = 0;
      s->units[v] = 0;
      if (local_20 < iVar2) {
        iVar3 = lit_sign(s->trail[local_20]);
        var_set_polar(s,v,(uint)((iVar3 != 0 ^ 0xffU) & 1));
      }
    }
    local_20 = s->qhead;
    while (local_20 = local_20 + -1, iVar1 <= local_20) {
      iVar2 = lit_var(s->trail[local_20]);
      order_unassigned(s,iVar2);
    }
    s->qtail = iVar1;
    s->qhead = iVar1;
    veci_resize(&s->trail_lim,level);
  }
  return;
}

Assistant:

static void solver2_canceluntil(sat_solver2* s, int level) {
    int      bound;
    int      lastLev;
    int      c, x;

    if (solver2_dlevel(s) <= level)
        return;
    assert( solver2_dlevel(s) > 0 );

    bound   = (veci_begin(&s->trail_lim))[level];
    lastLev = (veci_begin(&s->trail_lim))[veci_size(&s->trail_lim)-1];

    for (c = s->qtail-1; c >= bound; c--)
    {
        x = lit_var(s->trail[c]);
        var_set_value(s, x, varX);
        s->reasons[x] = 0;
        s->units[x] = 0; // temporary?
        if ( c < lastLev )
            var_set_polar(s, x, !lit_sign(s->trail[c]));
    }

    for (c = s->qhead-1; c >= bound; c--)
        order_unassigned(s,lit_var(s->trail[c]));

    s->qhead = s->qtail = bound;
    veci_resize(&s->trail_lim,level);
}